

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildIdentifier(CNscPStackEntry *pId)

{
  bool bVar1;
  CNscPStackEntry *pCVar2;
  NscSymbol *pSymbol_00;
  char *pcVar3;
  CNscPStackEntry *in_RDI;
  NscSymbolVariableExtra *pExtra;
  uchar *pauchInit;
  size_t nSymbol;
  NscSymbol *pSymbol;
  CNscPStackEntry *pOut;
  int in_stack_ffffffffffffff98;
  NscType in_stack_ffffffffffffff9c;
  CNscContext *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  CNscContext *pCVar4;
  int nElement;
  CNscPStackEntry *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  NscType nType;
  UINT32 in_stack_ffffffffffffffd0;
  
  pCVar2 = CNscContext::GetPStackEntry
                     (in_stack_ffffffffffffffa0,
                      (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  bVar1 = CNscContext::IsPhase2(g_pCtx);
  if ((bVar1) || (bVar1 = CNscContext::IsNWScript(g_pCtx), bVar1)) {
    pCVar4 = g_pCtx;
    CNscPStackEntry::GetIdentifier(in_RDI);
    pSymbol_00 = CNscContext::FindDeclSymbol
                           (in_stack_ffffffffffffffa0,
                            (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (pSymbol_00 == (NscSymbol *)0x0) {
      pCVar4 = g_pCtx;
      pcVar3 = CNscPStackEntry::GetIdentifier(in_RDI);
      CNscContext::GenerateMessage(pCVar4,NscMessage_ErrorUndeclaredIdentifier,pcVar3);
      CNscPStackEntry::SetType
                ((CNscPStackEntry *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
    else {
      if ((((pSymbol_00->field_6).field_2.ulFlags & 0x10000000) != 0) &&
         (((pSymbol_00->field_6).field_2.ulFlags & 0x1000000) == 0)) {
        CNscContext::GenerateMessage
                  (g_pCtx,NscMessage_WarningIdentUsedInInitializer,pSymbol_00->szString);
        (pSymbol_00->field_6).field_2.ulFlags = (pSymbol_00->field_6).field_2.ulFlags | 0x1000000;
      }
      if (pSymbol_00->nSymType == NscSymType_Function) {
        pCVar4 = g_pCtx;
        pcVar3 = CNscPStackEntry::GetIdentifier(in_RDI);
        CNscContext::GenerateMessage(pCVar4,NscMessage_ErrorInvalidUseOfFunction,pcVar3);
        CNscPStackEntry::SetType
                  ((CNscPStackEntry *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      }
      else if (pSymbol_00->nSymType == NscSymType_Structure) {
        pCVar4 = g_pCtx;
        pcVar3 = CNscPStackEntry::GetIdentifier(in_RDI);
        CNscContext::GenerateMessage(pCVar4,NscMessage_ErrorInvalidUseOfStructure,pcVar3);
        CNscPStackEntry::SetType
                  ((CNscPStackEntry *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      }
      else {
        CNscContext::GetSymbolOffset
                  (in_stack_ffffffffffffffa0,
                   (NscSymbol *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        if (((pSymbol_00->field_6).field_2.ulFlags & 0x80) == 0) {
          nElement = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
          nType = (NscType)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
          if (((pSymbol_00->field_6).field_2.ulFlags & 1) == 0) {
            in_stack_ffffffffffffff98 = (pSymbol_00->field_6).field_0.nEngineObject;
            CNscPStackEntry::PushVariable
                      ((CNscPStackEntry *)pCVar4,nType,(NscType)in_stack_ffffffffffffffb8,
                       (size_t)in_stack_ffffffffffffffb0,nElement,(int)in_stack_ffffffffffffffa8,
                       in_stack_ffffffffffffffd0);
          }
          else {
            in_stack_ffffffffffffff98 = (pSymbol_00->field_6).field_0.nEngineObject;
            CNscPStackEntry::PushVariable
                      ((CNscPStackEntry *)pCVar4,nType,(NscType)in_stack_ffffffffffffffb8,
                       (size_t)in_stack_ffffffffffffffb0,nElement,(int)in_stack_ffffffffffffffa8,
                       in_stack_ffffffffffffffd0);
          }
        }
        else {
          CNscContext::GetSymbolData
                    (in_stack_ffffffffffffffa0,
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
          CNscPStackEntry::AppendData
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                     (size_t)in_stack_ffffffffffffffa0);
        }
        CNscPStackEntry::SetType
                  ((CNscPStackEntry *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        NscParserReferenceSymbol(pSymbol_00);
      }
    }
    CNscContext::FreePStackEntry
              (in_stack_ffffffffffffffa0,
               (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  else {
    if (in_RDI != (CNscPStackEntry *)0x0) {
      CNscContext::FreePStackEntry
                (in_stack_ffffffffffffffa0,
                 (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
    CNscPStackEntry::SetType((CNscPStackEntry *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c)
    ;
  }
  return pCVar2;
}

Assistant:

YYSTYPE NscBuildIdentifier (YYSTYPE pId)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pId)
			g_pCtx ->FreePStackEntry (pId);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Search for the identifier
	//

	NscSymbol *pSymbol = g_pCtx ->FindDeclSymbol (pId ->GetIdentifier ());
	
	//
	// If the identifier wasn't found
	//

	if (pSymbol == NULL)
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorUndeclaredIdentifier,
			pId ->GetIdentifier ());
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, we have a good symbol
	//

	else
	{
		//
		// If we are defining the variable, the issue a warning and push the
		// default value (we can't reference the variable itself as it does not
		// yet have stack space allocated!).
		//

		if ((pSymbol ->ulFlags & NscSymFlag_BeingDefined) != 0)
		{
			if ((pSymbol ->ulFlags & NscSymFlag_SelfReferenceDef) == 0)
			{
				g_pCtx ->GenerateMessage (NscMessage_WarningIdentUsedInInitializer,
					pSymbol ->szString);
				pSymbol ->ulFlags |= NscSymFlag_SelfReferenceDef;
			}
		}

		//
		// If the symbol is a function
		//

		if (pSymbol ->nSymType == NscSymType_Function)
		{
			g_pCtx ->GenerateMessage (NscMessage_ErrorInvalidUseOfFunction,
				pId ->GetIdentifier ());
			pOut ->SetType (NscType_Error);
		}

		//
		// If the symbol is a structure
		//

		else if (pSymbol ->nSymType == NscSymType_Structure)
		{
			g_pCtx ->GenerateMessage (NscMessage_ErrorInvalidUseOfStructure,
				pId ->GetIdentifier ());
			pOut ->SetType (NscType_Error);
		}

		//
		// Otherwise, just a simple variable and not taken care of by default
		// initialization
		//

		else
		{

			//
			// Get the symbol offset
			//

			size_t nSymbol = g_pCtx ->GetSymbolOffset (pSymbol);

			//
			// If the symbol is a constant, then copy the initialization
			// code
			//

			if ((pSymbol ->ulFlags & NscSymFlag_Constant) != 0)
			{
				unsigned char *pauchInit = g_pCtx ->GetSymbolData (pSymbol ->nExtra);
				NscSymbolVariableExtra *pExtra = (NscSymbolVariableExtra *) pauchInit;
				pauchInit += sizeof (NscSymbolVariableExtra);
				pOut ->AppendData (pauchInit, pExtra ->nInitSize);
			}

			//
			// If the symbol is a global, push the variable
			//

			else if ((pSymbol ->ulFlags & NscSymFlag_Global) != 0)
			{
				pOut ->PushVariable (pSymbol ->nType, pSymbol ->nType, 
					nSymbol, -1, 0, pSymbol ->ulFlags);
			}

			//
			// If the symbol is a local, push the variable
			//

			else
			{
				pOut ->PushVariable (pSymbol ->nType, pSymbol ->nType, 
					nSymbol, -1, pSymbol ->nStackOffset, 
					pSymbol ->ulFlags);
			}

			//
			// Set the type
			//

			pOut ->SetType (pSymbol ->nType);

			//
			// Mark the symbol as referenced already (by the parser)
			//

			NscParserReferenceSymbol (pSymbol);
		}
	}

	//
	// Delete the input entry
	//

	g_pCtx ->FreePStackEntry (pId);
	return pOut;
}